

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wavelib.c
# Opt level: O2

void wtree_sym(wtree_object wt,double *inp,int N,double *cA,int len_cA,double *cD)

{
  long lVar1;
  wave_object pwVar2;
  long lVar3;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  double *pdVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  
  pwVar2 = wt->wave;
  uVar8 = 0;
  uVar5 = (ulong)(uint)pwVar2->lpd_len;
  if (pwVar2->lpd_len < 1) {
    uVar5 = uVar8;
  }
  uVar6 = (ulong)(uint)len_cA;
  if (len_cA < 1) {
    uVar6 = uVar8;
  }
  lVar10 = 0x7fffffff0;
  lVar11 = 1;
  do {
    if (uVar8 == uVar6) {
      return;
    }
    cA[uVar8] = 0.0;
    cD[uVar8] = 0.0;
    lVar1 = uVar8 * 2 + 1;
    lVar7 = 0;
    lVar12 = lVar11;
    for (lVar3 = 0; uVar5 * 8 != lVar3; lVar3 = lVar3 + 8) {
      if (lVar12 < N && -1 < lVar12) {
        pdVar4 = (double *)((long)pwVar2->lpd + lVar3);
        pdVar9 = inp + (lVar1 - lVar7);
LAB_0010401e:
        cA[uVar8] = *pdVar4 * *pdVar9 + cA[uVar8];
        cD[uVar8] = *(double *)((long)pwVar2->hpd + lVar3) * *pdVar9 + cD[uVar8];
      }
      else {
        if (lVar12 < 0) {
          pdVar4 = pwVar2->lpd + lVar7;
          pdVar9 = (double *)((long)inp + lVar3 + ((lVar10 << 0x1d) >> 0x1d));
          goto LAB_0010401e;
        }
        if (N <= lVar12) {
          pdVar4 = pwVar2->lpd + lVar7;
          pdVar9 = inp + (long)(N * 2 - (int)lVar1) + lVar7 + -1;
          goto LAB_0010401e;
        }
      }
      lVar7 = lVar7 + 1;
      lVar12 = lVar12 + -1;
    }
    uVar8 = uVar8 + 1;
    lVar10 = lVar10 + 0x7fffffff0;
    lVar11 = lVar11 + 2;
  } while( true );
}

Assistant:

static void wtree_sym(wtree_object wt, double *inp, int N, double *cA, int len_cA, double *cD) {
	int i, l, t, len_avg;

	len_avg = wt->wave->lpd_len;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + 1;
		cA[i] = 0.0;
		cD[i] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= 0 && (t - l) < N) {
				cA[i] += wt->wave->lpd[l] * inp[t - l];
				cD[i] += wt->wave->hpd[l] * inp[t - l];
			}
			else if ((t - l) < 0) {
				cA[i] += wt->wave->lpd[l] * inp[-t + l - 1];
				cD[i] += wt->wave->hpd[l] * inp[-t + l - 1];
			}
			else if ((t - l) >= N) {
				cA[i] += wt->wave->lpd[l] * inp[2 * N - t + l - 1];
				cD[i] += wt->wave->hpd[l] * inp[2 * N - t + l - 1];
			}

		}
	}


}